

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.c
# Opt level: O1

int us_socket_write(int ssl,us_socket_t *s,char *data,int length,int msg_more)

{
  us_loop_t *loop;
  int iVar1;
  ssize_t sVar2;
  
  if (ssl != 0) {
    iVar1 = us_internal_ssl_socket_write((us_internal_ssl_socket_t *)s,data,length,msg_more);
    return iVar1;
  }
  if (((us_socket_context_t *)s->prev != s->context) &&
     (iVar1 = us_internal_poll_type(&s->p), iVar1 != 1)) {
    iVar1 = us_poll_fd(&s->p);
    sVar2 = send(iVar1,data,(long)length,msg_more << 0xf | 0x4000);
    iVar1 = (int)sVar2;
    if (iVar1 != length) {
      loop = s->context->loop;
      (loop->data).last_write_failed = 1;
      us_poll_change(&s->p,loop,5);
    }
    if (iVar1 < 1) {
      return 0;
    }
    return iVar1;
  }
  return 0;
}

Assistant:

int us_socket_write(int ssl, struct us_socket_t *s, const char *data, int length, int msg_more) {
#ifndef LIBUS_NO_SSL
    if (ssl) {
        return us_internal_ssl_socket_write((struct us_internal_ssl_socket_t *) s, data, length, msg_more);
    }
#endif

    if (us_socket_is_closed(ssl, s) || us_socket_is_shut_down(ssl, s)) {
        return 0;
    }

    int written = bsd_send(us_poll_fd(&s->p), data, length, msg_more);
    if (written != length) {
        s->context->loop->data.last_write_failed = 1;
        us_poll_change(&s->p, s->context->loop, LIBUS_SOCKET_READABLE | LIBUS_SOCKET_WRITABLE);
    }

    return written < 0 ? 0 : written;
}